

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

string * __thiscall AlignmentRecord::getAlignSequence2_abi_cxx11_(AlignmentRecord *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,(string *)(in_RSI + 0x240));
  return in_RDI;
}

Assistant:

std::string AlignmentRecord::getAlignSequence2() const{
    return this->alignSequence2;
}